

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

IdleDecommitSignal __thiscall Memory::HeapInfo::LeaveIdleDecommit(HeapInfo *this,bool allowTimer)

{
  anon_class_16_2_20d366e1 local_50;
  anon_class_16_2_20d366e1 local_40;
  IdleDecommitSignal local_2c [2];
  IdleDecommitSignal idleDecommitSignal;
  
  local_50.idleDecommitSignal = local_2c;
  local_2c[0] = IdleDecommitSignal_None;
  local_50.allowTimer = allowTimer;
  local_40.idleDecommitSignal = local_50.idleDecommitSignal;
  local_40.allowTimer = allowTimer;
  LeaveIdleDecommit::anon_class_16_2_20d366e1::operator()
            (&local_50,&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator);
  LeaveIdleDecommit::anon_class_16_2_20d366e1::operator()
            (&local_50,&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator);
  LeaveIdleDecommit::anon_class_16_2_20d366e1::operator()
            (&local_50,&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator);
  LeaveIdleDecommit::anon_class_16_2_20d366e1::operator()(&local_40,this->recyclerLeafPageAllocator)
  ;
  return local_2c[0];
}

Assistant:

IdleDecommitSignal
HeapInfo::LeaveIdleDecommit(bool allowTimer)
{
    IdleDecommitSignal idleDecommitSignal = IdleDecommitSignal_None;
    ForEachPageAllocator([&idleDecommitSignal, allowTimer](IdleDecommitPageAllocator * pageAlloc)
    {
        IdleDecommitSignal signal = pageAlloc->LeaveIdleDecommit(allowTimer);
        idleDecommitSignal = max(idleDecommitSignal, signal);
    });
    return idleDecommitSignal;
}